

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  uint8_t *__s;
  uint8_t uVar1;
  uint8_t uVar2;
  void *pvVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  ulong __n;
  
  puVar5 = *src;
  iVar4 = 0x32;
  if (1 < (ulong)((long)end - (long)puVar5)) {
    *src = puVar5 + 1;
    uVar1 = *puVar5;
    puVar6 = puVar5 + 2;
    *src = puVar6;
    if ((ulong)CONCAT11(uVar1,puVar5[1]) <= (ulong)((long)end - (long)puVar6)) {
      puVar5 = puVar6 + CONCAT11(uVar1,puVar5[1]);
      do {
        if (puVar6 == puVar5) {
          return 0x32;
        }
        *src = puVar6 + 1;
        if ((ulong)((long)puVar5 - (long)(puVar6 + 1)) < 2) {
          return 0x32;
        }
        uVar1 = *puVar6;
        *src = puVar6 + 2;
        uVar2 = puVar6[1];
        __s = puVar6 + 3;
        *src = __s;
        __n = (ulong)CONCAT11(uVar2,puVar6[2]);
        if ((ulong)((long)puVar5 - (long)__s) < __n) {
          return 0x32;
        }
        if (uVar1 == '\0') {
          pvVar3 = memchr(__s,0,__n);
          if (pvVar3 != (void *)0x0) {
            return 0x2f;
          }
          name->base = __s;
          name->len = __n;
        }
        puVar6 = __s + __n;
        *src = puVar6;
      } while (puVar6 != puVar5);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        do {
            uint8_t type;
            if ((ret = ptls_decode8(&type, src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}